

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

void lscpp::protocol::from_json(json *j,DocumentDiagnosticParams *p)

{
  DocumentDiagnosticParams *pDVar1;
  const_reference this;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  DocumentDiagnosticParams *local_18;
  DocumentDiagnosticParams *p_local;
  json *j_local;
  
  local_18 = p;
  p_local = (DocumentDiagnosticParams *)j;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"workDoneToken",&local_39);
  serializer_impl_::from_optional<std::variant<int,std::__cxx11::string>>
            (j,&local_38,
             (optional<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pDVar1 = p_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"partialResultToken",&local_71);
  serializer_impl_::from_optional<std::variant<int,std::__cxx11::string>>
            ((json *)pDVar1,&local_70,&(local_18->super_PartialResultParams).partialResultToken);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  this = nlohmann::json_abi_v3_11_2::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::at<const_char_(&)[13],_0>
                   ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)p_local,(char (*) [13])"textDocument");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_to<lscpp::protocol::TextDocumentIdentifier,_0>(this,&local_18->textDocument);
  pDVar1 = p_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"identifier",&local_99);
  serializer_impl_::from_optional<std::__cxx11::string>
            ((json *)pDVar1,&local_98,&local_18->identifier);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pDVar1 = p_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"previousResultId",&local_c1);
  serializer_impl_::from_optional<std::__cxx11::string>
            ((json *)pDVar1,&local_c0,&local_18->previousResultId);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  return;
}

Assistant:

void from_json(const nlohmann::json &j, protocol::DocumentDiagnosticParams &p) {
  FROM_OPTIONAL(workDoneToken);
  FROM_OPTIONAL(partialResultToken);
  j.at("textDocument").get_to(p.textDocument);
  FROM_OPTIONAL(identifier);
  FROM_OPTIONAL(previousResultId);
}